

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile,string *objPath)

{
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *this_00;
  bool bVar1;
  cmake *pcVar2;
  string *psVar3;
  type pcVar4;
  ostream *poVar5;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  undefined1 local_158 [8];
  string sourceFileName;
  string local_118;
  string local_f8;
  cmAlphaNum local_d8;
  cmAlphaNum local_98;
  undefined1 local_68 [8];
  string buildFilePath;
  string buildFileDir;
  string *objPath_local;
  string *sourceFile_local;
  string *commandLine_local;
  cmGlobalNinjaGenerator *this_local;
  
  pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar2);
  std::__cxx11::string::string((string *)(buildFilePath.field_2._M_local_buf + 8),(string *)psVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->CompileCommandsStream);
  if (bVar1) {
    pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->CompileCommandsStream);
    std::operator<<((ostream *)pcVar4,",\n");
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_98,(string *)((long)&buildFilePath.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_d8,"/compile_commands.json");
    cmStrCat<>((string *)local_68,&local_98,&local_d8);
    if ((this->ComputingUnknownDependencies & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"compile_commands.json",
                 (allocator<char> *)&stack0xfffffffffffffee7);
      NinjaOutputPath(&local_f8,this,&local_118);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->CombinedBuildOutputs,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
    }
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&sourceFileName.field_2 + 8));
    this_00 = (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
              ((long)&sourceFileName.field_2 + 8);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
              (&this->CompileCommandsStream,this_00);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              (this_00);
    pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->CompileCommandsStream);
    std::operator<<((ostream *)pcVar4,"[\n");
    std::__cxx11::string::~string((string *)local_68);
  }
  std::__cxx11::string::string((string *)local_158,(string *)sourceFile);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_158);
  if (!bVar1) {
    pcVar2 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar2);
    cmsys::SystemTools::CollapseFullPath(&local_178,(string *)local_158,psVar3);
    std::__cxx11::string::operator=((string *)local_158,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
  }
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->CompileCommandsStream);
  poVar5 = std::operator<<((ostream *)pcVar4,"{\n");
  poVar5 = std::operator<<(poVar5,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_198,(string *)((long)&buildFilePath.field_2 + 8));
  poVar5 = std::operator<<(poVar5,(string *)&local_198);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_1b8,commandLine);
  poVar5 = std::operator<<(poVar5,(string *)&local_1b8);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_1d8,(string *)local_158);
  poVar5 = std::operator<<(poVar5,(string *)&local_1d8);
  poVar5 = std::operator<<(poVar5,"\",\n");
  poVar5 = std::operator<<(poVar5,"  \"output\": \"");
  cmGlobalGenerator::EscapeJSON(&local_1f8,objPath);
  poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
  poVar5 = std::operator<<(poVar5,"\"\n");
  std::operator<<(poVar5,"}");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)(buildFilePath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
  const std::string& commandLine, const std::string& sourceFile,
  const std::string& objPath)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream) {
    std::string buildFilePath =
      cmStrCat(buildFileDir, "/compile_commands.json");
    if (this->ComputingUnknownDependencies) {
      this->CombinedBuildOutputs.insert(
        this->NinjaOutputPath("compile_commands.json"));
    }

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      cm::make_unique<cmGeneratedFileStream>(buildFilePath);
    *this->CompileCommandsStream << "[\n";
  } else {
    *this->CompileCommandsStream << ",\n";
  }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName)) {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName, this->GetCMakeInstance()->GetHomeOutputDirectory());
  }

  /* clang-format off */
  *this->CompileCommandsStream << "{\n"
     << R"(  "directory": ")"
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << R"(  "command": ")"
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << R"(  "file": ")"
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\",\n"
     << R"(  "output": ")"
     << cmGlobalGenerator::EscapeJSON(objPath) << "\"\n"
     << "}";
  /* clang-format on */
}